

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

send_result_t
zmq::send_multipart<std::vector<zmq::message_t,std::allocator<zmq::message_t>>&,void>
          (socket_ref s,vector<zmq::message_t,_std::allocator<zmq::message_t>_> *msgs,
          send_flags flags)

{
  pointer pmVar1;
  size_t in_RCX;
  undefined4 in_register_00000014;
  ulong uVar2;
  ulong extraout_RDX;
  undefined8 uVar3;
  _Storage<unsigned_long,_true> _Var4;
  int in_R8D;
  pointer pmVar5;
  send_result_t sVar6;
  socket_base local_38;
  
  uVar2 = CONCAT44(in_register_00000014,flags);
  pmVar1 = (msgs->super__Vector_base<zmq::message_t,_std::allocator<zmq::message_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  _Var4._M_value = 0;
  pmVar5 = (msgs->super__Vector_base<zmq::message_t,_std::allocator<zmq::message_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = s.super_socket_base._handle;
  do {
    if (pmVar5 == pmVar1) {
      uVar3 = CONCAT71((int7)(uVar2 >> 8),1);
LAB_00141d70:
      sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
      sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var4._M_value;
      return (send_result_t)
             sVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    detail::socket_base::send
              (&local_38,(int)pmVar5,(void *)(ulong)((uint)(pmVar5 + 1 != pmVar1) * 2 | flags),
               in_RCX,in_R8D);
    if ((extraout_RDX & 1) == 0) {
      if (pmVar5 != (msgs->super__Vector_base<zmq::message_t,_std::allocator<zmq::message_t>_>).
                    _M_impl.super__Vector_impl_data._M_start) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::vector<zmq::message_t> &]"
                     );
      }
      uVar3 = 0;
      goto LAB_00141d70;
    }
    _Var4._M_value = _Var4._M_value + 1;
    uVar2 = extraout_RDX;
    pmVar5 = pmVar5 + 1;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}